

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O2

void __thiscall Am_Drawonable_Impl::Print(Am_Drawonable_Impl *this,ostream *os)

{
  ostream *poVar1;
  
  std::operator<<(os,(this->super_Am_Drawonable).title);
  poVar1 = std::operator<<(os," (");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::operator<<(poVar1,")");
  return;
}

Assistant:

void
Am_Drawonable_Impl::Print(std::ostream &os) const
{
  os << this->Get_Title();
  os << " (" << std::hex << (void *)this << std::dec << ")";
}